

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.h
# Opt level: O0

Extent<double> * __thiscall
Parfait::Octree<Parfait::Facet>::Node::getChild3Extent
          (Extent<double> *__return_storage_ptr__,Node *this,Extent<double> *extent)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Extent<double> *childExtent;
  Extent<double> *extent_local;
  Node *this_local;
  
  memcpy(__return_storage_ptr__,extent,0x30);
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->lo,1);
  dVar1 = *pdVar3;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->hi,1);
  dVar2 = *pdVar3;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->lo,1);
  *pdVar3 = (dVar1 + dVar2) * 0.5;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->lo,0);
  dVar1 = *pdVar3;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->hi,0);
  dVar2 = *pdVar3;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->hi,0);
  *pdVar3 = (dVar1 + dVar2) * 0.5;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->lo,2);
  dVar1 = *pdVar3;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->hi,2);
  dVar2 = *pdVar3;
  pdVar3 = Point<double>::operator[](&__return_storage_ptr__->hi,2);
  *pdVar3 = (dVar1 + dVar2) * 0.5;
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Extent<double> getChild3Extent(const Parfait::Extent<double> &extent){
              Parfait::Extent<double> childExtent = extent;
              childExtent.lo[1] = 0.5*(childExtent.lo[1] + childExtent.hi[1]);
              childExtent.hi[0] = 0.5*(childExtent.lo[0] + childExtent.hi[0]);
              childExtent.hi[2] = 0.5*(childExtent.lo[2] + childExtent.hi[2]);
              return childExtent;
          }